

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

string * __thiscall
pbrt::PlanarMapping2D::ToString_abi_cxx11_(string *__return_storage_ptr__,PlanarMapping2D *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,float_const&,float_const&>
            (__return_storage_ptr__,"[ PlanarMapping2D vs: %s vt: %s ds: %f dt: %f]",&this->vs,
             &this->vt,&this->ds,&this->dt);
  return __return_storage_ptr__;
}

Assistant:

std::string PlanarMapping2D::ToString() const {
    return StringPrintf("[ PlanarMapping2D vs: %s vt: %s ds: %f dt: %f]", vs, vt, ds, dt);
}